

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Gia_ManSuperCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  
  for (; ((ulong)pObj & 1) == 0;
      pObj = (Gia_Obj_t *)
             ((ulong)(uVar4 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar4 & 0x1fffffff)))) {
    uVar4 = (uint)*(undefined8 *)pObj;
    if ((((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) ||
       ((uVar4 & 0x1fffffff) <= ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) break;
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_007ddeee;
    if ((p->pMuxes != (uint *)0x0) &&
       (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] != 0)) break;
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_007ddeee;
    if ((1 < p->pRefs[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555]) ||
       (100 < p->vSuper->nSize)) break;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar4 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar4 & 0x1fffffff))));
    uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
  }
  pGVar3 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar3) && (pGVar3 < pGVar1 + p->nObjs)) {
    iVar2 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2);
    if (-1 < iVar2 * -0x55555555) {
      Vec_IntPush(p->vSuper,((uint)pObj & 1) + iVar2 * 0x55555556);
      return;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_007ddeee:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Gia_ManSuperCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_IsComplement(pObj) || 
        !Gia_ObjIsAndReal(p, pObj) || 
        Gia_ObjRefNum(p, pObj) > 1 || 
//        Gia_ObjRefNum(p, pObj) > 3 || 
//        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > STR_SUPER )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj) );
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj) );
}